

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O2

void __thiscall SchnorrSig_SetSigHashType_Test::TestBody(SchnorrSig_SetSigHashType_Test *this)

{
  char *message;
  AssertHelper local_70;
  undefined1 local_68 [16];
  AssertionResult gtest_ar;
  SigHashAlgorithm local_34;
  SchnorrSignature sig;
  
  std::__cxx11::string::string
            ((string *)&gtest_ar,
             "6470fd1303dda4fda717b9837153c24a6eab377183fc438f939e0ed2b620e9ee5077c4a8b8dca28963d772a94f5f0ddf598e1c47c137f91933274c7c3edadce8"
             ,(allocator *)local_68);
  cfd::core::SchnorrSignature::SchnorrSignature(&sig,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::SigHashType::SigHashType((SigHashType *)&gtest_ar,kSigHashAll,false,false);
  cfd::core::SchnorrSignature::SetSigHashType(&sig,(SigHashType *)&gtest_ar);
  local_70.data_._0_4_ = 1;
  cfd::core::SchnorrSignature::GetSigHashType((SchnorrSignature *)local_68);
  local_34 = cfd::core::SigHashType::GetSigHashAlgorithm((SigHashType *)local_68);
  testing::internal::CmpHelperEQ<cfd::core::SigHashAlgorithm,cfd::core::SigHashAlgorithm>
            ((internal *)&gtest_ar,"SigHashAlgorithm::kSigHashAll",
             "sig.GetSigHashType().GetSigHashAlgorithm()",(SigHashAlgorithm *)&local_70,&local_34);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x61,message);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
  return;
}

Assistant:

TEST(SchnorrSig, SetSigHashType) {
  SchnorrSignature sig(
    "6470fd1303dda4fda717b9837153c24a6eab377183fc438f939e0ed2b620e9ee"
    "5077c4a8b8dca28963d772a94f5f0ddf598e1c47c137f91933274c7c3edadce8");
  sig.SetSigHashType(SigHashType(SigHashAlgorithm::kSigHashAll));
  EXPECT_EQ(SigHashAlgorithm::kSigHashAll,
      sig.GetSigHashType().GetSigHashAlgorithm());
}